

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_portals.cxx
# Opt level: O1

void __thiscall xray_re::xr_portal_object::save(xr_portal_object *this,xr_writer *w)

{
  pointer p_Var1;
  pointer p_Var2;
  short local_1a;
  
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_raw_chunk(w,0xfa10,&PORTAL_VERSION,2,false);
  if ((this->m_sector_front)._M_string_length != 0) {
    xr_writer::open_chunk(w,0xfa30);
    xr_writer::w_sz(w,&this->m_sector_front);
    xr_writer::close_chunk(w);
  }
  if ((this->m_sector_back)._M_string_length != 0) {
    xr_writer::open_chunk(w,0xfa40);
    xr_writer::w_sz(w,&this->m_sector_back);
    xr_writer::close_chunk(w);
  }
  xr_writer::open_chunk(w,0xfa50);
  local_1a = (short)((uint)(*(int *)&(this->m_vertices).
                                     super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->m_vertices).
                                    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x5555;
  (*w->_vptr_xr_writer[2])(w,&local_1a,2);
  p_Var1 = (this->m_vertices).
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (this->m_vertices).
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (p_Var1 != p_Var2) {
    (*w->_vptr_xr_writer[2])(w,p_Var1,(long)p_Var2 - (long)p_Var1);
  }
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_portal_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(PORTAL_CHUNK_VERSION, PORTAL_VERSION);
	if (!m_sector_front.empty())
		w.w_chunk(PORTAL_CHUNK_SECTOR_FRONT, m_sector_front);
	if (!m_sector_back.empty())
		w.w_chunk(PORTAL_CHUNK_SECTOR_BACK, m_sector_back);
	w.open_chunk(PORTAL_CHUNK_VERTICES);
	w.w_size_u16(m_vertices.size());
	w.w_seq(m_vertices);
	w.close_chunk();
}